

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

bool duckdb_re2::IsValidUTF8(StringPiece *s,RegexpStatus *status)

{
  bool bVar1;
  int iVar2;
  undefined8 *in_RDI;
  RegexpStatus *in_stack_00000008;
  Rune r;
  StringPiece t;
  StringPiece local_28 [2];
  
  local_28[0].data_ = (const_pointer)*in_RDI;
  local_28[0].size_ = in_RDI[1];
  do {
    bVar1 = StringPiece::empty(local_28);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return true;
    }
    iVar2 = StringPieceToRune((Rune *)t.size_,(StringPiece *)t.data_,in_stack_00000008);
  } while (-1 < iVar2);
  return false;
}

Assistant:

static bool IsValidUTF8(const StringPiece& s, RegexpStatus* status) {
  StringPiece t = s;
  Rune r;
  while (!t.empty()) {
    if (StringPieceToRune(&r, &t, status) < 0)
      return false;
  }
  return true;
}